

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall VarianceEstimator_MergeTwo_Test::TestBody(VarianceEstimator_MergeTwo_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  VarianceEstimator<double> *pVVar4;
  double dVar5;
  double dVar6;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  Float varError;
  AssertionResult gtest_ar;
  Float meanErr;
  Float u;
  Stratified1DIter __end1;
  Stratified1DIter __begin1;
  Stratified1D *__range1;
  int index;
  VarianceEstimator<double> veBoth;
  VarianceEstimator<double> ve [2];
  Stratified1DIter *in_stack_fffffffffffffe68;
  IndexingIterator<pbrt::detail::Stratified1DIter> *in_stack_fffffffffffffe70;
  VarianceEstimator<double> *in_stack_fffffffffffffe78;
  VarianceEstimator<double> *this_01;
  VarianceEstimator<double> *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  int iVar7;
  AssertionResult *this_02;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined8 in_stack_fffffffffffffe98;
  Type type;
  VarianceEstimator<double> *this_03;
  VarianceEstimator<double> *local_120;
  Message *in_stack_fffffffffffffee8;
  AssertHelper *in_stack_fffffffffffffef0;
  AssertionResult local_100;
  float local_ec;
  double *in_stack_ffffffffffffff20;
  float *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *expr1;
  AssertionResult local_c0;
  float local_b0;
  Float local_ac;
  IndexingIterator<pbrt::detail::Stratified1DIter> local_90 [3];
  undefined1 local_78 [24];
  undefined1 *local_60;
  int local_54;
  VarianceEstimator<double> local_50;
  VarianceEstimator<double> local_38;
  VarianceEstimator<double> local_20;
  
  local_120 = &local_38;
  do {
    pbrt::VarianceEstimator<double>::VarianceEstimator(local_120);
    local_120 = local_120 + 1;
  } while (local_120 != (VarianceEstimator<double> *)&stack0xfffffffffffffff8);
  pbrt::VarianceEstimator<double>::VarianceEstimator(&local_50);
  local_54 = 0;
  pbrt::Stratified1D::RNGGenerator
            ((Stratified1D *)in_stack_fffffffffffffe80,
             (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(uint64_t)in_stack_fffffffffffffe70,
             (uint64_t)in_stack_fffffffffffffe68);
  local_60 = local_78;
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::begin
            ((IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)
             in_stack_fffffffffffffe70);
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::end
            ((IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)
             in_stack_fffffffffffffe70);
  while( true ) {
    bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Stratified1DIter>::operator!=
                      (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    type = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    iVar7 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    if (!bVar1) break;
    local_ac = pbrt::detail::Stratified1DIter::operator*
                         ((Stratified1DIter *)in_stack_fffffffffffffe70);
    if (local_54 < 400) {
      local_54 = local_54 + 1;
      pbrt::VarianceEstimator<double>::Add(&local_38,(double)(local_ac * local_ac * local_ac));
    }
    else {
      local_54 = local_54 + 1;
      pbrt::VarianceEstimator<double>::Add(&local_20,(double)(local_ac * local_ac * local_ac));
    }
    pbrt::VarianceEstimator<double>::Add(&local_50,(double)(local_ac * local_ac * local_ac));
    pbrt::detail::IndexingIterator<pbrt::detail::Stratified1DIter>::operator++(local_90);
  }
  this_03 = &local_38;
  pbrt::VarianceEstimator<double>::Merge(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  dVar5 = pbrt::VarianceEstimator<double>::Mean(this_03);
  pVVar4 = &local_50;
  dVar6 = pbrt::VarianceEstimator<double>::Mean(&local_50);
  dVar5 = dVar5 - dVar6;
  std::abs((int)pVVar4);
  dVar6 = pbrt::VarianceEstimator<double>::Mean(&local_50);
  local_b0 = (float)(dVar5 / dVar6);
  expr1 = (char *)0x3ee4f8b588e368f1;
  testing::internal::CmpHelperLT<float,double>
            ((char *)0x3ee4f8b588e368f1,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x644b1b);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),iVar7,
               (char *)in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0x644b78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x644bd0);
  this_00 = (AssertHelper *)pbrt::VarianceEstimator<double>::Variance(&local_38);
  pVVar4 = &local_50;
  this_01 = pVVar4;
  dVar5 = pbrt::VarianceEstimator<double>::Variance(pVVar4);
  pcVar3 = (char *)((double)this_00 - dVar5);
  std::abs((int)pVVar4);
  dVar5 = pbrt::VarianceEstimator<double>::Variance(this_01);
  local_ec = (float)((double)pcVar3 / dVar5);
  this_02 = &local_100;
  testing::internal::CmpHelperLT<float,double>
            (expr1,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_02);
  iVar7 = (int)((ulong)this_02 >> 0x20);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_03);
    testing::AssertionResult::failure_message((AssertionResult *)0x644cdb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe90),iVar7,
               pcVar3);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x644d36);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x644d8b);
  return;
}

Assistant:

TEST(VarianceEstimator, MergeTwo) {
    VarianceEstimator<double> ve[2], veBoth;

    int index = 0;
    for (Float u : Stratified1D(1000)) {
        if (index++ < 400)
            ve[0].Add(u * u * u);
        else
            ve[1].Add(u * u * u);
        veBoth.Add(u * u * u);
    }

    ve[0].Merge(ve[1]);

    Float meanErr = std::abs(ve[0].Mean() - veBoth.Mean()) / veBoth.Mean();
    EXPECT_LT(meanErr, 1e-5);

    Float varError = std::abs(ve[0].Variance() - veBoth.Variance()) / veBoth.Variance();
    EXPECT_LT(varError, 1e-5);
}